

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::GetLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger SVar1;
  SQLocalVarInfo *pSVar2;
  bool bVar3;
  SQUnsignedInteger in_RAX;
  SQUnsignedInteger SVar4;
  
  pSVar2 = (this->_vlocals)._vals;
  SVar4 = (this->_vlocals)._size;
  do {
    if ((long)SVar4 < 1) {
      return -1;
    }
    SVar1 = SVar4 - 1;
    if ((pSVar2[SVar1]._name.super_SQObject._type == OT_STRING) &&
       (pSVar2[SVar1]._name.super_SQObject._unVal.pTable == (name->_unVal).pTable)) {
      bVar3 = false;
      in_RAX = SVar1;
    }
    else {
      bVar3 = true;
      SVar4 = SVar1;
    }
  } while (bVar3);
  return in_RAX;
}

Assistant:

SQInteger SQFuncState::GetLocalVariable(const SQObject &name)
{
    SQInteger locals=_vlocals.size();
    while(locals>=1){
        SQLocalVarInfo &lvi = _vlocals[locals-1];
        if(sq_type(lvi._name)==OT_STRING && _string(lvi._name)==_string(name)){
            return locals-1;
        }
        locals--;
    }
    return -1;
}